

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O2

CURLcode tftp_rx(tftp_state_data *state,tftp_event_t event)

{
  unsigned_short uVar1;
  Curl_easy *data;
  curl_trc_feat *pcVar2;
  uint uVar3;
  time_t tVar4;
  ssize_t sVar5;
  int *piVar6;
  char *pcVar7;
  int iVar8;
  ushort uVar9;
  char buffer [256];
  
  data = state->data;
  switch(event) {
  case TFTP_EVENT_DATA:
    uVar9 = *(ushort *)((state->rpacket).data + 2);
    uVar9 = uVar9 << 8 | uVar9 >> 8;
    uVar3 = *(int *)&state->block + 1;
    if (uVar9 == (ushort)uVar3) {
      state->retries = 0;
    }
    else {
      if ((ushort)*(int *)&state->block != uVar9) {
        if (data == (Curl_easy *)0x0) {
          return CURLE_OK;
        }
        if (((data->set).field_0x89f & 0x40) == 0) {
          return CURLE_OK;
        }
        pcVar2 = (data->state).feat;
        if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
          return CURLE_OK;
        }
        Curl_infof(data,"Received unexpected DATA packet block %d, expecting block %d",(ulong)uVar9,
                   (ulong)(uVar3 & 0xffff));
        return CURLE_OK;
      }
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        Curl_infof(data,"Received last DATA packet block %d again.",(ulong)uVar9);
      }
    }
    state->block = uVar9;
    *(state->spacket).data = '\0';
    (state->spacket).data[1] = '\x04';
    uVar1 = state->block;
    (state->spacket).data[2] = (uchar)(uVar1 >> 8);
    (state->spacket).data[3] = (uchar)uVar1;
    sVar5 = sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
                   state->remote_addrlen);
    if (-1 < sVar5) {
      state->state = (uint)((long)state->rbytes < (long)((ulong)state->blksize + 4)) * 2 +
                     TFTP_STATE_RX;
LAB_00159554:
      tVar4 = time((time_t *)0x0);
      state->rx_time = tVar4;
      return CURLE_OK;
    }
    break;
  default:
    Curl_failf(data,"%s","tftp_rx: internal error");
    return CURLE_TFTP_ILLEGAL;
  case TFTP_EVENT_ERROR:
    *(state->spacket).data = '\0';
    (state->spacket).data[1] = '\x05';
    uVar1 = state->block;
    (state->spacket).data[2] = (uchar)(uVar1 >> 8);
    (state->spacket).data[3] = (uchar)uVar1;
    sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
           state->remote_addrlen);
LAB_0015961d:
    state->state = TFTP_STATE_FIN;
    return CURLE_OK;
  case TFTP_EVENT_OACK:
    state->block = 0;
    state->retries = 0;
    *(state->spacket).data = '\0';
    (state->spacket).data[1] = '\x04';
    uVar1 = state->block;
    (state->spacket).data[2] = (uchar)(uVar1 >> 8);
    (state->spacket).data[3] = (uchar)uVar1;
    sVar5 = sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
                   state->remote_addrlen);
    if (-1 < sVar5) {
      state->state = TFTP_STATE_RX;
      goto LAB_00159554;
    }
    break;
  case TFTP_EVENT_TIMEOUT:
    iVar8 = state->retries + 1;
    state->retries = iVar8;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(data,"Timeout waiting for block %d ACK. Retries = %d",
                 (ulong)(*(int *)&state->block + 1U & 0xffff));
      iVar8 = state->retries;
    }
    if (state->retry_max < iVar8) {
      state->error = TFTP_ERR_TIMEOUT;
      goto LAB_0015961d;
    }
    sVar5 = sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
                   state->remote_addrlen);
    if (-1 < sVar5) {
      return CURLE_OK;
    }
  }
  piVar6 = __errno_location();
  pcVar7 = Curl_strerror(*piVar6,buffer,0x100);
  Curl_failf(data,"%s",pcVar7);
  return CURLE_SEND_ERROR;
}

Assistant:

static CURLcode tftp_rx(struct tftp_state_data *state,
                        tftp_event_t event)
{
  ssize_t sbytes;
  int rblock;
  struct Curl_easy *data = state->data;
  char buffer[STRERROR_LEN];

  switch(event) {

  case TFTP_EVENT_DATA:
    /* Is this the block we expect? */
    rblock = getrpacketblock(&state->rpacket);
    if(NEXT_BLOCKNUM(state->block) == rblock) {
      /* This is the expected block. Reset counters and ACK it. */
      state->retries = 0;
    }
    else if(state->block == rblock) {
      /* This is the last recently received block again. Log it and ACK it
         again. */
      infof(data, "Received last DATA packet block %d again.", rblock);
    }
    else {
      /* totally unexpected, just log it */
      infof(data,
            "Received unexpected DATA packet block %d, expecting block %d",
            rblock, NEXT_BLOCKNUM(state->block));
      break;
    }

    /* ACK this block. */
    state->block = (unsigned short)rblock;
    setpacketevent(&state->spacket, TFTP_EVENT_ACK);
    setpacketblock(&state->spacket, state->block);
    sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                    4, SEND_4TH_ARG,
                    (struct sockaddr *)&state->remote_addr,
                    state->remote_addrlen);
    if(sbytes < 0) {
      failf(data, "%s", Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      return CURLE_SEND_ERROR;
    }

    /* Check if completed (That is, a less than full packet is received) */
    if(state->rbytes < (ssize_t)state->blksize + 4) {
      state->state = TFTP_STATE_FIN;
    }
    else {
      state->state = TFTP_STATE_RX;
    }
    state->rx_time = time(NULL);
    break;

  case TFTP_EVENT_OACK:
    /* ACK option acknowledgement so we can move on to data */
    state->block = 0;
    state->retries = 0;
    setpacketevent(&state->spacket, TFTP_EVENT_ACK);
    setpacketblock(&state->spacket, state->block);
    sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                    4, SEND_4TH_ARG,
                    (struct sockaddr *)&state->remote_addr,
                    state->remote_addrlen);
    if(sbytes < 0) {
      failf(data, "%s", Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      return CURLE_SEND_ERROR;
    }

    /* we are ready to RX data */
    state->state = TFTP_STATE_RX;
    state->rx_time = time(NULL);
    break;

  case TFTP_EVENT_TIMEOUT:
    /* Increment the retry count and fail if over the limit */
    state->retries++;
    infof(data,
          "Timeout waiting for block %d ACK. Retries = %d",
          NEXT_BLOCKNUM(state->block), state->retries);
    if(state->retries > state->retry_max) {
      state->error = TFTP_ERR_TIMEOUT;
      state->state = TFTP_STATE_FIN;
    }
    else {
      /* Resend the previous ACK */
      sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                      4, SEND_4TH_ARG,
                      (struct sockaddr *)&state->remote_addr,
                      state->remote_addrlen);
      if(sbytes < 0) {
        failf(data, "%s", Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
        return CURLE_SEND_ERROR;
      }
    }
    break;

  case TFTP_EVENT_ERROR:
    setpacketevent(&state->spacket, TFTP_EVENT_ERROR);
    setpacketblock(&state->spacket, state->block);
    (void)sendto(state->sockfd, (void *)state->spacket.data,
                 4, SEND_4TH_ARG,
                 (struct sockaddr *)&state->remote_addr,
                 state->remote_addrlen);
    /* do not bother with the return code, but if the socket is still up we
     * should be a good TFTP client and let the server know we are done */
    state->state = TFTP_STATE_FIN;
    break;

  default:
    failf(data, "%s", "tftp_rx: internal error");
    return CURLE_TFTP_ILLEGAL; /* not really the perfect return code for
                                  this */
  }
  return CURLE_OK;
}